

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

Iterator __thiscall List<String>::insert(List<String> *this,Iterator *position,String *value)

{
  Item *pIVar1;
  Item *pIVar2;
  ItemBlock *pIVar3;
  ulong uVar4;
  Iterator *pIVar5;
  Item *this_00;
  
  this_00 = this->freeItem;
  if (this_00 == (Item *)0x0) {
    pIVar3 = (ItemBlock *)operator_new__(0xe8);
    pIVar3->next = this->blocks;
    this->blocks = pIVar3;
    this_00 = (Item *)0x0;
    for (uVar4 = 8; uVar4 < 0xe8; uVar4 = uVar4 + 0x38) {
      pIVar3[6].next = (ItemBlock *)this_00;
      this_00 = (Item *)(pIVar3 + 1);
      pIVar3 = pIVar3 + 7;
    }
    this->freeItem = this_00;
  }
  String::String(&this_00->value,value);
  this->freeItem = this_00->prev;
  pIVar1 = position->item;
  pIVar2 = pIVar1->prev;
  pIVar5 = (Iterator *)&pIVar2->next;
  if (pIVar2 == (Item *)0x0) {
    pIVar5 = &this->_begin;
  }
  this_00->prev = pIVar2;
  pIVar5->item = this_00;
  this_00->next = pIVar1;
  pIVar1->prev = this_00;
  this->_size = this->_size + 1;
  return (Iterator)this_00;
}

Assistant:

Iterator insert(const Iterator& position, const T& value)
  {
    Item* item = freeItem;
    if(!item)
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      for(Item* i = (Item*)(itemBlock + 1), * end = i + 4; i < end; ++i)
      {
        i->prev = item;
        item = i;
      }
      freeItem = item;
    }

    new(item) Item(value);
    freeItem = item->prev;

    Item* insertPos = position.item;
    if((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;

    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return item;
  }